

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O1

void __thiscall
KktCheck::setIndexVectors
          (KktCheck *this,vector<int,_std::allocator<int>_> *rIndex,
          vector<int,_std::allocator<int>_> *cIndex)

{
  iterator iVar1;
  undefined8 in_RAX;
  pointer piVar2;
  ulong uVar3;
  undefined8 local_38;
  
  piVar2 = (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  piVar2 = (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar2) {
    (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  piVar2 = (rIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_38 = in_RAX;
  if ((rIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    uVar3 = 0;
    do {
      if (piVar2[uVar3] != -1) {
        local_38 = CONCAT44((int)uVar3,(int)local_38);
        iVar1._M_current =
             (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&this->rIndexRev,iVar1,(int *)((long)&local_38 + 4));
        }
        else {
          *iVar1._M_current = (int)uVar3;
          (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      uVar3 = uVar3 + 1;
      piVar2 = (rIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(rIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar2 >> 2));
  }
  piVar2 = (cIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((cIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    uVar3 = 0;
    do {
      if (piVar2[uVar3] != -1) {
        local_38 = CONCAT44(local_38._4_4_,(int)uVar3);
        iVar1._M_current =
             (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&this->cIndexRev,iVar1,(int *)&local_38);
        }
        else {
          *iVar1._M_current = (int)uVar3;
          (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
      }
      uVar3 = uVar3 + 1;
      piVar2 = (cIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(cIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar2 >> 2));
  }
  return;
}

Assistant:

void KktCheck::setIndexVectors(vector<int>& rIndex, vector<int>& cIndex){
	rIndexRev.clear();
	cIndexRev.clear();

	for (size_t i=0;i<rIndex.size(); i++) {
		if (rIndex[i] != -1) {
			rIndexRev.push_back(i);
		}
	}
	for (size_t i=0;i<cIndex.size(); i++) {
		if (cIndex[i] != -1) {
			cIndexRev.push_back(i);
		}
	}

}